

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void ga_twist_log(ga_twist *xd)

{
  undefined8 in_RAX;
  
  if (xd == (ga_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x114,"void ga_twist_log(const struct ga_twist *)");
  }
  if (xd->point == (point *)0x0) {
    __assert_fail("xd->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x115,"void ga_twist_log(const struct ga_twist *)");
  }
  if (xd->target_body == (body *)0x0) {
    __assert_fail("xd->target_body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x116,"void ga_twist_log(const struct ga_twist *)");
  }
  if (xd->reference_body != (body *)0x0) {
    if (xd->frame != (frame *)0x0) {
      printf("TwistADT(target=%s|%s, reference=%s, frame={%s})\n",xd->point->name,
             xd->target_body->name,xd->reference_body->name,xd->frame->name,in_RAX);
      return;
    }
    __assert_fail("xd->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x118,"void ga_twist_log(const struct ga_twist *)");
  }
  __assert_fail("xd->reference_body",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x117,"void ga_twist_log(const struct ga_twist *)");
}

Assistant:

void ga_twist_log(
        const struct ga_twist *xd)
{
    assert(xd);
    assert(xd->point);
    assert(xd->target_body);
    assert(xd->reference_body);
    assert(xd->frame);

    printf("TwistADT(target=%s|%s, reference=%s, frame={%s})\n",
            xd->point->name,
            xd->target_body->name,
            xd->reference_body->name,
            xd->frame->name);
}